

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O3

EventSignalPtr * __thiscall entityx::EventManager::signal_for(EventManager *this,size_t id)

{
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer psVar3;
  undefined1 local_29;
  Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = &this->handlers_;
  psVar3 = (this->handlers_).
           super__Vector_base<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->handlers_).
                    super__Vector_base<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= id) {
    std::
    vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
    ::resize(this_00,id + 1);
    psVar3 = (this_00->
             super__Vector_base<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  if (psVar3[id].
      super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,std::allocator<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>>
              (&_Stack_20,&local_28,
               (allocator<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                *)&local_29);
    _Var2._M_pi = _Stack_20._M_pi;
    pSVar1 = local_28;
    psVar3 = (this_00->
             super__Vector_base<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_28 = (Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = psVar3[id].
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    psVar3 = psVar3 + id;
    (psVar3->
    super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = pSVar1;
    (psVar3->
    super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = _Var2._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
    psVar3 = (this_00->
             super__Vector_base<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  return psVar3 + id;
}

Assistant:

EventSignalPtr &signal_for(std::size_t id) {
    if (id >= handlers_.size())
      handlers_.resize(id + 1);
    if (!handlers_[id])
      handlers_[id] = std::make_shared<EventSignal>();
    return handlers_[id];
  }